

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
CLOptions::GetShortOpts
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,CLOptions *this,string *short_opts)

{
  char cVar1;
  bool bVar2;
  pointer ppVar3;
  mapped_type *pmVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  char *__rhs;
  iterator dbl_itr;
  iterator bool_itr;
  iterator str_itr;
  iterator int_itr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_40;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  local_38;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"h",(allocator *)&local_88);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getValue(&local_60,
           &(this->version_opt).
            super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          );
  cVar1 = std::__cxx11::string::empty();
  __rhs = "v";
  if (cVar1 != '\0') {
    __rhs = "";
  }
  std::operator+(&local_a8,&local_80,__rhs);
  std::__cxx11::string::operator=((string *)short_opts,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_88);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                       *)&local_60);
  local_60._M_dataplus._M_p =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                ::begin(&this->params_bools);
  while( true ) {
    local_a8._M_dataplus._M_p =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                  ::end(&this->params_bools);
    bVar2 = std::operator!=((_Self *)&local_60,(_Self *)&local_a8);
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                           *)&local_60);
    cVar1 = CLParam<bool>::getShortParamName((CLParam<bool> *)ppVar3->second);
    if ('\n' < cVar1) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                             *)&local_60);
      CLParam<bool>::getShortParamNameStr_abi_cxx11_(&local_80,(CLParam<bool> *)ppVar3->second);
      std::operator+(&local_a8,&local_80,":");
      std::__cxx11::string::operator+=((string *)short_opts,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_80);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                             *)&local_60);
      CLParam<bool>::getParamName_abi_cxx11_(&local_a8,(CLParam<bool> *)ppVar3->second);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                             *)&local_60);
      cVar1 = CLParam<bool>::getShortParamName((CLParam<bool> *)ppVar3->second);
      local_80._M_dataplus._M_p._0_4_ = (int)cVar1;
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_80);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                  *)&local_60);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  ::_Rb_tree_iterator(&local_88);
  local_88._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
       ::begin(&this->params_doubles);
  while( true ) {
    local_a8._M_dataplus._M_p =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                  ::end(&this->params_doubles);
    bVar2 = std::operator!=(&local_88,(_Self *)&local_a8);
    if (!bVar2) break;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
             ::operator->(&local_88);
    cVar1 = CLParam<double>::getShortParamName(&ppVar5->second->super_CLParam<double>);
    if ('\n' < cVar1) {
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
               ::operator->(&local_88);
      CLParam<double>::getShortParamNameStr_abi_cxx11_
                (&local_80,&ppVar5->second->super_CLParam<double>);
      std::operator+(&local_a8,&local_80,":");
      std::__cxx11::string::operator+=((string *)short_opts,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_80);
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
               ::operator->(&local_88);
      CLParam<double>::getParamName_abi_cxx11_(&local_a8,&ppVar5->second->super_CLParam<double>);
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
               ::operator->(&local_88);
      cVar1 = CLParam<double>::getShortParamName(&ppVar5->second->super_CLParam<double>);
      local_80._M_dataplus._M_p._0_4_ = (int)cVar1;
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_80);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator++(&local_88);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  ::_Rb_tree_iterator(&local_38);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
       ::begin(&this->params_ints);
  while( true ) {
    local_a8._M_dataplus._M_p =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                  ::end(&this->params_ints);
    bVar2 = std::operator!=(&local_38,(_Self *)&local_a8);
    if (!bVar2) break;
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
             ::operator->(&local_38);
    cVar1 = CLParam<int>::getShortParamName((CLParam<int> *)ppVar6->second);
    if ('\n' < cVar1) {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
               ::operator->(&local_38);
      CLParam<int>::getShortParamNameStr_abi_cxx11_(&local_80,(CLParam<int> *)ppVar6->second);
      std::operator+(&local_a8,&local_80,":");
      std::__cxx11::string::operator+=((string *)short_opts,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_80);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
               ::operator->(&local_38);
      CLParam<int>::getParamName_abi_cxx11_(&local_a8,(CLParam<int> *)ppVar6->second);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
               ::operator->(&local_38);
      cVar1 = CLParam<int>::getShortParamName((CLParam<int> *)ppVar6->second);
      local_80._M_dataplus._M_p._0_4_ = (int)cVar1;
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_80);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator++(&local_38);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  ::_Rb_tree_iterator(&local_40);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
       ::begin(&this->params_strings);
  while( true ) {
    local_a8._M_dataplus._M_p =
         (pointer)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                  ::end(&this->params_strings);
    bVar2 = std::operator!=(&local_40,(_Self *)&local_a8);
    if (!bVar2) break;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
             ::operator->(&local_40);
    cVar1 = CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::getShortParamName(&ppVar7->second->
                                 super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               );
    if ('\n' < cVar1) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
               ::operator->(&local_40);
      CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      getShortParamNameStr
                (&local_80,
                 &ppVar7->second->
                  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
      std::operator+(&local_a8,&local_80,":");
      std::__cxx11::string::operator+=((string *)short_opts,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_80);
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
               ::operator->(&local_40);
      CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      getParamName(&local_a8,
                   &ppVar7->second->
                    super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
               ::operator->(&local_40);
      cVar1 = CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::getShortParamName(&ppVar7->second->
                                   super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 );
      local_80._M_dataplus._M_p._0_4_ = (int)cVar1;
      pmVar4 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](__return_storage_ptr__,(key_type *)&local_80);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::string> CLOptions::GetShortOpts(std::string& short_opts)
{
    // Fill with the default help and version information
    short_opts = std::string("h") + (version_opt.getValue().empty() ? "" : "v") ;
    
    // Create a map of "short" -> "long" variables
    std::map<int,std::string> short_to_long ;
    
    std::map<std::string, CLBool*>::iterator bool_itr ;
    for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr) {
        if (bool_itr->second->getShortParamName() > 10) {
            short_opts += bool_itr->second->getShortParamNameStr()+":";
            short_to_long[bool_itr->second->getShortParamName()] = bool_itr->second->getParamName() ;
        }
    }
    // DOUBLES
    std::map<std::string, CLDouble*>::iterator dbl_itr ;
    for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr) {
        if (dbl_itr->second->getShortParamName() > 10) {
            short_opts += dbl_itr->second->getShortParamNameStr()+":";
            short_to_long[dbl_itr->second->getShortParamName()] = dbl_itr->second->getParamName() ;
        }
    }
    // INTEGERS
    std::map<std::string, CLInt*>::iterator int_itr ;
    for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr) {
        if (int_itr->second->getShortParamName() > 10) {
            short_opts += int_itr->second->getShortParamNameStr()+":";
            short_to_long[int_itr->second->getShortParamName()] = int_itr->second->getParamName() ;
        }
    }
    // STRINGS
    std::map<std::string, CLString*>::iterator str_itr ;
    for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr) {
        if (str_itr->second->getShortParamName() > 10) {
            short_opts += str_itr->second->getShortParamNameStr()+":";
            short_to_long[str_itr->second->getShortParamName()] = str_itr->second->getParamName() ;
        }
    }
    
    return short_to_long ;
}